

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O1

void __thiscall cmCTestLaunch::LoadConfig(cmCTestLaunch *this)

{
  pointer pcVar1;
  bool bVar2;
  string fname;
  cmake cm;
  cmMakefile mf;
  cmGlobalGenerator gg;
  undefined1 local_11a8 [40];
  string local_1180;
  cmake local_1160;
  undefined1 local_e08 [2024];
  cmGlobalGenerator local_620;
  
  cmake::cmake(&local_1160,RoleScript,CTest);
  pcVar1 = local_e08 + 0x10;
  local_e08._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e08,"");
  cmake::SetHomeDirectory(&local_1160,(string *)local_e08);
  if ((pointer)local_e08._0_8_ != pcVar1) {
    operator_delete((void *)local_e08._0_8_,local_e08._16_8_ + 1);
  }
  local_e08._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e08,"");
  cmake::SetHomeOutputDirectory(&local_1160,(string *)local_e08);
  if ((pointer)local_e08._0_8_ != pcVar1) {
    operator_delete((void *)local_e08._0_8_,local_e08._16_8_ + 1);
  }
  local_e08._16_8_ = local_1160.CurrentSnapshot.Position.Position;
  local_e08._0_8_ = local_1160.CurrentSnapshot.State;
  local_e08._8_8_ = local_1160.CurrentSnapshot.Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_e08);
  cmGlobalGenerator::cmGlobalGenerator(&local_620,&local_1160);
  local_11a8._16_8_ = local_1160.CurrentSnapshot.Position.Position;
  local_11a8._0_8_ = local_1160.CurrentSnapshot.State;
  local_11a8._8_8_ = local_1160.CurrentSnapshot.Position.Tree;
  cmMakefile::cmMakefile((cmMakefile *)local_e08,&local_620,(cmStateSnapshot *)local_11a8);
  pcVar1 = (this->LogDir)._M_dataplus._M_p;
  local_11a8._0_8_ = (cmState *)(local_11a8 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_11a8,pcVar1,pcVar1 + (this->LogDir)._M_string_length);
  std::__cxx11::string::append(local_11a8);
  bVar2 = cmsys::SystemTools::FileExists((string *)local_11a8);
  if (bVar2) {
    bVar2 = cmMakefile::ReadListFile((cmMakefile *)local_e08,(string *)local_11a8);
    if (bVar2) {
      local_1180._M_dataplus._M_p = (pointer)&local_1180.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1180,"CTEST_SOURCE_DIRECTORY","");
      cmMakefile::GetSafeDefinition((cmMakefile *)local_e08,&local_1180);
      std::__cxx11::string::_M_assign((string *)&this->SourceDir);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1180._M_dataplus._M_p != &local_1180.field_2) {
        operator_delete(local_1180._M_dataplus._M_p,local_1180.field_2._M_allocated_capacity + 1);
      }
      cmsys::SystemTools::ConvertToUnixSlashes(&this->SourceDir);
    }
  }
  if ((cmState *)local_11a8._0_8_ != (cmState *)(local_11a8 + 0x10)) {
    operator_delete((void *)local_11a8._0_8_,local_11a8._16_8_ + 1);
  }
  cmMakefile::~cmMakefile((cmMakefile *)local_e08);
  cmGlobalGenerator::~cmGlobalGenerator(&local_620);
  cmake::~cmake(&local_1160);
  return;
}

Assistant:

void cmCTestLaunch::LoadConfig()
{
  cmake cm(cmake::RoleScript, cmState::CTest);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  cmMakefile mf(&gg, cm.GetCurrentSnapshot());
  std::string fname = this->LogDir;
  fname += "CTestLaunchConfig.cmake";
  if (cmSystemTools::FileExists(fname) && mf.ReadListFile(fname)) {
    this->SourceDir = mf.GetSafeDefinition("CTEST_SOURCE_DIRECTORY");
    cmSystemTools::ConvertToUnixSlashes(this->SourceDir);
  }
}